

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_response.cc
# Opt level: O3

int __thiscall CreateResponse::Update(CreateResponse *this,ByteBuffer *buffer)

{
  element_type *peVar1;
  
  NamenodeResponse::Update(&this->super_NamenodeResponse,buffer);
  FileInfo::Update(&this->file_info_,buffer);
  FileInfo::Update(&this->parent_info_,buffer);
  peVar1 = (this->file_block_).super___shared_ptr<BlockInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_BlockInfo[2])(peVar1,buffer);
  peVar1 = (this->parent_block_).super___shared_ptr<BlockInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_BlockInfo[2])(peVar1,buffer);
  return 0;
}

Assistant:

int CreateResponse::Update(ByteBuffer &buffer) {
  NamenodeResponse::Update(buffer);

  file_info_.Update(buffer);
  parent_info_.Update(buffer);
  file_block_->Update(buffer);
  parent_block_->Update(buffer);

  return 0;
}